

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statemachine.cpp
# Opt level: O2

callback_t *
end_property_state(callback_t *__return_storage_ptr__,MetaConfiguration *conf,ifstream *f,int *error
                  )

{
  QDebug *debug;
  QDebug local_40 [8];
  __shared_ptr<MetaProperty,_(__gnu_cxx::_Lock_policy)2> local_38;
  undefined4 uStack_28;
  undefined4 local_24;
  undefined8 local_20;
  
  std::vector<std::shared_ptr<MetaProperty>,_std::allocator<std::shared_ptr<MetaProperty>_>_>::
  push_back((anonymous_namespace)::current_class,
            (value_type *)&(anonymous_namespace)::current_property);
  parser();
  if ((parser()::category[0x10] & 1) != 0) {
    parser();
    local_38._M_ptr._0_4_ = 2;
    local_38._M_ptr._4_4_ = 0;
    local_38._M_refcount._M_pi._0_4_ = 0;
    local_38._M_refcount._M_pi._4_4_ = 0;
    uStack_28 = 0;
    local_24 = 0;
    local_20 = parser()::category._8_8_;
    QMessageLogger::debug();
    debug = QDebug::operator<<(local_40,"finishing property");
    operator<<(debug,(string *)((anonymous_namespace)::current_property + 0x10));
    QDebug::~QDebug(local_40);
  }
  local_38._M_ptr._0_4_ = 0;
  local_38._M_ptr._4_4_ = 0;
  local_38._M_refcount._M_pi._0_4_ = 0;
  local_38._M_refcount._M_pi._4_4_ = 0;
  std::__shared_ptr<MetaProperty,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<MetaProperty,_(__gnu_cxx::_Lock_policy)2> *)
             &(anonymous_namespace)::current_property,&local_38);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38._M_refcount);
  *(undefined8 *)((long)&(__return_storage_ptr__->super__Function_base)._M_functor + 8) = 0;
  *(code **)&(__return_storage_ptr__->super__Function_base)._M_functor = class_state;
  __return_storage_ptr__->_M_invoker =
       std::
       _Function_handler<RecursiveHelper<MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&>_(MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&),_std::function<RecursiveHelper<MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&>_(MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&)>_(*)(MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&)>
       ::_M_invoke;
  (__return_storage_ptr__->super__Function_base)._M_manager =
       std::
       _Function_handler<RecursiveHelper<MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&>_(MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&),_std::function<RecursiveHelper<MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&>_(MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&)>_(*)(MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&)>
       ::_M_manager;
  return __return_storage_ptr__;
}

Assistant:

callback_t end_property_state(MetaConfiguration &conf, std::ifstream &f,
                              int &error) {
  current_class->properties.push_back(current_property);
  qCDebug(parser) << "finishing property" << current_property->name;
  current_property = nullptr;
  return class_state;
}